

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpec::NamePattern::~NamePattern(NamePattern *this)

{
  (this->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__NamePattern_001690b0;
  WildcardPattern::~WildcardPattern(&this->m_wildcardPattern);
  return;
}

Assistant:

TestSpec::NamePattern::~NamePattern() {}